

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O1

string * __thiscall
jbcoin::STTx::getMetaSQL
          (string *__return_storage_ptr__,STTx *this,uint32_t inLedger,string *escapedMetaData)

{
  string *psVar1;
  pointer __dest;
  ulong uVar2;
  size_t __n;
  Serializer s;
  Serializer local_70;
  Serializer local_58;
  string *local_38;
  
  local_38 = __return_storage_ptr__;
  Serializer::Serializer(&local_70,0x100);
  STObject::add(&this->super_STObject,&local_70,true);
  local_58.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = (long)local_70.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_70.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (uVar2 == 0) {
    __dest = (pointer)0x0;
  }
  else {
    if ((long)uVar2 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(uVar2);
  }
  local_58.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __dest + uVar2;
  __n = (long)local_70.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_70.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_58.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = __dest;
  if (__n != 0) {
    local_58.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = __dest;
    memmove(__dest,local_70.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,__n);
  }
  psVar1 = local_38;
  local_58.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = __dest + __n;
  getMetaSQL(local_38,this,&local_58,inLedger,'V',escapedMetaData);
  if (__dest != (pointer)0x0) {
    operator_delete(__dest,uVar2);
  }
  if (local_70.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.mData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.mData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return psVar1;
}

Assistant:

std::string STTx::getMetaSQL (std::uint32_t inLedger,
                                               std::string const& escapedMetaData) const
{
    Serializer s;
    add (s);
    return getMetaSQL (s, inLedger, TXN_SQL_VALIDATED, escapedMetaData);
}